

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFont::RenderChar(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,ImWchar c)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ushort uVar5;
  undefined6 in_register_0000000a;
  ImFontGlyph *pIVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  
  if ((0x20 < (uint)CONCAT62(in_register_0000000a,c)) ||
     ((0x100002600U >> ((ulong)c & 0x3f) & 1) == 0)) {
    if (((int)(uint)c < (this->IndexLookup).Size) &&
       (uVar5 = (this->IndexLookup).Data[c], uVar5 != 0xffff)) {
      pIVar6 = (ImFontGlyph *)
               ((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar5 * 0x28));
    }
    else {
      pIVar6 = this->FallbackGlyph;
    }
    if (pIVar6 != (ImFontGlyph *)0x0) {
      fVar7 = (float)(-(uint)(size < 0.0) & 0x3f800000 |
                     ~-(uint)(size < 0.0) & (uint)(size / this->FontSize));
      fVar8 = (float)(int)((this->DisplayOffset).x + pos.x);
      fVar9 = (float)(int)((this->DisplayOffset).y + pos.y);
      ImDrawList::PrimReserve(draw_list,6,4);
      uVar1 = pIVar6->X0;
      uVar3 = pIVar6->Y0;
      local_20.x = (float)uVar1 * fVar7 + fVar8;
      local_20.y = (float)uVar3 * fVar7 + fVar9;
      uVar2 = pIVar6->X1;
      uVar4 = pIVar6->Y1;
      local_28.x = (float)uVar2 * fVar7 + fVar8;
      local_28.y = (float)uVar4 * fVar7 + fVar9;
      local_30.x = pIVar6->U0;
      local_30.y = pIVar6->V0;
      local_38.x = pIVar6->U1;
      local_38.y = pIVar6->V1;
      ImDrawList::PrimRectUV(draw_list,&local_20,&local_28,&local_30,&local_38,col);
    }
  }
  return;
}

Assistant:

void ImFont::RenderChar(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, ImWchar c) const
{
    if (c == ' ' || c == '\t' || c == '\n' || c == '\r') // Match behavior of RenderText(), those 4 codepoints are hard-coded.
        return;
    if (const ImFontGlyph* glyph = FindGlyph(c))
    {
        float scale = (size >= 0.0f) ? (size / FontSize) : 1.0f;
        pos.x = IM_FLOOR(pos.x + DisplayOffset.x);
        pos.y = IM_FLOOR(pos.y + DisplayOffset.y);
        draw_list->PrimReserve(6, 4);
        draw_list->PrimRectUV(ImVec2(pos.x + glyph->X0 * scale, pos.y + glyph->Y0 * scale), ImVec2(pos.x + glyph->X1 * scale, pos.y + glyph->Y1 * scale), ImVec2(glyph->U0, glyph->V0), ImVec2(glyph->U1, glyph->V1), col);
    }
}